

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O2

void __thiscall wirehair::Codec::SetupTriangle(Codec *this)

{
  uint16_t uVar1;
  uint16_t uVar2;
  ushort uVar3;
  undefined2 uVar4;
  uint uVar5;
  uint uVar6;
  uint16_t *puVar7;
  uint8_t *puVar8;
  uint64_t *puVar9;
  ushort uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  
  puVar7 = this->_pivots;
  uVar10 = this->_dense_count + this->_defer_count;
  for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
    puVar7[uVar11] = (uint16_t)uVar11;
  }
  this->_next_pivot = 0;
  this->_pivot_count = (uint)uVar10;
  if (this->_first_heavy_column != 0) {
    return;
  }
  uVar1 = this->_defer_count;
  uVar2 = this->_mix_count;
  uVar11 = (ulong)this->_pivot_count;
  uVar10 = uVar1 + this->_dense_count;
  uVar13 = (ulong)this->_pivot_count;
  do {
    puVar7 = this->_pivots;
    do {
      if ((int)uVar11 < 1) {
        this->_first_heavy_pivot = (uint)uVar13;
        puVar7 = this->_pivots;
        uVar14 = this->_pivot_count;
        for (lVar12 = 0; lVar12 != 6; lVar12 = lVar12 + 1) {
          uVar4 = this->_extra_count;
          puVar7[uVar14 + (int)lVar12] = uVar10 + (short)lVar12 + uVar4;
        }
        this->_pivot_count = uVar14 + 6;
        return;
      }
      uVar3 = puVar7[uVar11 - 1];
      uVar11 = uVar11 - 1;
    } while (uVar3 < uVar10);
    if (this->_next_pivot <= uVar11) {
      uVar13 = (ulong)((uint)uVar13 - 1);
      puVar7[uVar11] = puVar7[uVar13];
      puVar7[uVar13] = uVar3;
    }
    uVar5 = this->_ge_pitch;
    uVar6 = this->_heavy_pitch;
    puVar8 = this->_heavy_matrix;
    puVar9 = this->_ge_matrix;
    for (uVar14 = this->_first_heavy_column; uVar14 < (ushort)(uVar2 + uVar1); uVar14 = uVar14 + 1)
    {
      puVar8[(ulong)(uVar14 - this->_first_heavy_column) +
             (ulong)(((uint)uVar3 - (uint)uVar10) * uVar6)] =
           (puVar9[(ulong)(uVar3 * uVar5) + (ulong)(uVar14 >> 6)] >> ((ulong)uVar14 & 0x3f) & 1) !=
           0;
    }
  } while( true );
}

Assistant:

void Codec::SetupTriangle()
{
    CAT_IF_DUMP(cout << endl << "---- SetupTriangle ----" << endl << endl;)

    CAT_DEBUG_ASSERT((unsigned)_defer_count + (unsigned)_dense_count < 65536);
    const uint16_t pivot_count = _defer_count + _dense_count;

    // Initialize pivot array to just non-heavy rows
    for (uint16_t pivot_i = 0; pivot_i < pivot_count; ++pivot_i) {
        _pivots[pivot_i] = pivot_i;
    }

    // Set resume point to the first column
    _next_pivot = 0;
    _pivot_count = pivot_count;

    // If heavy rows are used right from the start:
    if (_first_heavy_column <= 0) {
        InsertHeavyRows();
    }
}